

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardEuler.cpp
# Opt level: O2

void __thiscall
iDynTree::optimalcontrol::integrators::ForwardEuler::~ForwardEuler(ForwardEuler *this)

{
  (this->super_FixedStepIntegrator).super_Integrator._vptr_Integrator =
       (_func_int **)&PTR__ForwardEuler_001d4728;
  std::
  _Rb_tree<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>,_std::_Select1st<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::~_Rb_tree(&(this->m_controlHessianSparsity)._M_t);
  std::
  _Rb_tree<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>,_std::_Select1st<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::~_Rb_tree(&(this->m_stateControlHessianSparsity)._M_t);
  std::
  _Rb_tree<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>,_std::_Select1st<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::optimalcontrol::SparsityStructure>_>_>
  ::~_Rb_tree(&(this->m_stateHessianSparsity)._M_t);
  std::
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ::~vector(&this->m_controlJacobianSparsity);
  std::
  vector<iDynTree::optimalcontrol::SparsityStructure,_std::allocator<iDynTree::optimalcontrol::SparsityStructure>_>
  ::~vector(&this->m_stateJacobianSparsity);
  iDynTree::VectorDynSize::~VectorDynSize(&this->m_lambda);
  iDynTree::MatrixDynSize::~MatrixDynSize(&this->m_mixedHessianBuffer);
  iDynTree::MatrixDynSize::~MatrixDynSize(&this->m_controlHessianBuffer);
  iDynTree::MatrixDynSize::~MatrixDynSize(&this->m_stateHessianBuffer);
  iDynTree::MatrixDynSize::~MatrixDynSize(&this->m_zeroNxNuBuffer);
  iDynTree::MatrixDynSize::~MatrixDynSize(&this->m_zeroNuNuBuffer);
  iDynTree::MatrixDynSize::~MatrixDynSize(&this->m_zeroNxNxBuffer);
  iDynTree::MatrixDynSize::~MatrixDynSize(&this->m_identity);
  iDynTree::MatrixDynSize::~MatrixDynSize(&this->m_controlJacBuffer);
  iDynTree::MatrixDynSize::~MatrixDynSize(&this->m_stateJacBuffer);
  iDynTree::VectorDynSize::~VectorDynSize(&this->m_computationBuffer);
  FixedStepIntegrator::~FixedStepIntegrator(&this->super_FixedStepIntegrator);
  return;
}

Assistant:

ForwardEuler::~ForwardEuler() {}